

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int __thiscall CVmHandleManager::alloc_handle(CVmHandleManager *this,void *item)

{
  void **ppvVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar2 = this->handles_max_;
  if (sVar2 == 0) {
    sVar3 = 0;
LAB_00241e5b:
    sVar4 = sVar3;
    if (sVar3 != sVar2) goto LAB_00241e95;
  }
  else {
    sVar3 = 0;
    do {
      if (this->handles_[sVar3] == (void *)0x0) goto LAB_00241e5b;
      sVar3 = sVar3 + 1;
      sVar4 = sVar2;
    } while (sVar2 != sVar3);
  }
  this->handles_max_ = sVar2 + 0x20;
  ppvVar1 = (void **)realloc(this->handles_,sVar2 * 8 + 0x100);
  this->handles_ = ppvVar1;
  for (; sVar3 = sVar4, sVar2 < this->handles_max_; sVar2 = sVar2 + 1) {
    this->handles_[sVar2] = (void *)0x0;
  }
LAB_00241e95:
  this->handles_[sVar3] = item;
  return (int)sVar3 + 1;
}

Assistant:

int CVmHandleManager::alloc_handle(void *item)
{
    size_t slot;

    /* scan for a free slot */
    for (slot = 0 ; slot < handles_max_ ; ++slot)
    {
        /* if this one is free, use it */
        if (handles_[slot] == 0)
            break;
    }

    /* if we didn't find a free slot, extend the array */
    if (slot == handles_max_)
    {
        size_t i;

        /* allocate a larger array */
        handles_max_ += 32;
        handles_ = (void **)
                   t3realloc(handles_, handles_max_ * sizeof(*handles_));

        /* clear out the newly-allocated slots */
        for (i = slot ; i < handles_max_ ; ++i)
            handles_[i] = 0;
    }

    /* store the new item in our pointer array */
    handles_[slot] = item;

    /* 
     *   convert the slot number to a handle by adjusting it to a 1-based
     *   index, and return the result 
     */
    return slot + 1;
}